

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

TRANSPORT_LL_HANDLE
IoTHubTransport_MQTT_Common_Register
          (TRANSPORT_LL_HANDLE handle,IOTHUB_DEVICE_CONFIG *device,PDLIST_ENTRY waitingToSend)

{
  int iVar1;
  IOTHUB_CREDENTIAL_TYPE IVar2;
  LOGGER_LOG p_Var3;
  char *__s1;
  char *pcVar4;
  
  if ((device == (IOTHUB_DEVICE_CONFIG *)0x0 || handle == (TRANSPORT_LL_HANDLE)0x0) ||
      waitingToSend == (PDLIST_ENTRY)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar4 = "IoTHubTransport_MQTT_Common_Register: handle, device or waitingToSend is NULL.";
    iVar1 = 0xf4c;
    goto LAB_0012d191;
  }
  if (device->deviceId == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar4 = "IoTHubTransport_MQTT_Common_Register: deviceId is NULL.";
    iVar1 = 0xf55;
    goto LAB_0012d191;
  }
  if ((device->deviceKey != (char *)0x0) && (device->deviceSasToken != (char *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar4 = 
    "IoTHubTransport_MQTT_Common_Register: Both deviceKey and deviceSasToken are defined. Only one can be used."
    ;
    iVar1 = 0xf5a;
    goto LAB_0012d191;
  }
  pcVar4 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x40));
  iVar1 = strcmp(pcVar4,device->deviceId);
  if (iVar1 != 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar4 = "IoTHubTransport_MQTT_Common_Register: deviceId does not match.";
    iVar1 = 0xf61;
    goto LAB_0012d191;
  }
  __s1 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x48));
  pcVar4 = device->moduleId;
  if (((__s1 != (char *)0x0 && pcVar4 == (char *)0x0) ||
      (__s1 == (char *)0x0 && pcVar4 != (char *)0x0)) ||
     ((__s1 != (char *)0x0 || pcVar4 != (char *)0x0 && (iVar1 = strcmp(__s1,pcVar4), iVar1 != 0))))
  {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar4 = "IoTHubTransport_MQTT_Common_Register: moduleId does not match.";
    iVar1 = 0xf66;
    goto LAB_0012d191;
  }
  IVar2 = IoTHubClient_Auth_Get_Credential_Type
                    (*(IOTHUB_AUTHORIZATION_HANDLE *)((long)handle + 0x118));
  if (IVar2 == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
    if (device->deviceKey != (char *)0x0) {
      pcVar4 = IoTHubClient_Auth_Get_DeviceKey
                         (*(IOTHUB_AUTHORIZATION_HANDLE *)((long)handle + 0x118));
      iVar1 = strcmp(pcVar4,device->deviceKey);
      if (iVar1 == 0) goto LAB_0012d200;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar4 = "IoTHubTransport_MQTT_Common_Register: deviceKey does not match.";
    iVar1 = 0xf6c;
  }
  else {
LAB_0012d200:
    if (*(char *)((long)handle + 0x84) != '\x01') {
      *(undefined1 *)((long)handle + 0x84) = 1;
      return handle;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar4 = "Transport already has device registered by id: [%s]";
    iVar1 = 0xf73;
  }
LAB_0012d191:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
            ,"IoTHubTransport_MQTT_Common_Register",iVar1,1,pcVar4);
  return (TRANSPORT_LL_HANDLE)0x0;
}

Assistant:

TRANSPORT_LL_HANDLE IoTHubTransport_MQTT_Common_Register(TRANSPORT_LL_HANDLE handle, const IOTHUB_DEVICE_CONFIG* device, PDLIST_ENTRY waitingToSend)
{
    TRANSPORT_LL_HANDLE result = NULL;

    if ((handle == NULL) || (device == NULL) || (waitingToSend == NULL))
    {
        LogError("IoTHubTransport_MQTT_Common_Register: handle, device or waitingToSend is NULL.");
        result = NULL;
    }
    else
    {
        MQTTTRANSPORT_HANDLE_DATA* transport_data = (MQTTTRANSPORT_HANDLE_DATA*)handle;

        if (device->deviceId == NULL)
        {
            LogError("IoTHubTransport_MQTT_Common_Register: deviceId is NULL.");
            result = NULL;
        }
        else if ((device->deviceKey != NULL) && (device->deviceSasToken != NULL))
        {
            LogError("IoTHubTransport_MQTT_Common_Register: Both deviceKey and deviceSasToken are defined. Only one can be used.");
            result = NULL;
        }
        else
        {
            if (strcmp(STRING_c_str(transport_data->device_id), device->deviceId) != 0)
            {
                LogError("IoTHubTransport_MQTT_Common_Register: deviceId does not match.");
                result = NULL;
            }
            else if (!checkModuleIdsEqual(STRING_c_str(transport_data->module_id), device->moduleId))
            {
                LogError("IoTHubTransport_MQTT_Common_Register: moduleId does not match.");
                result = NULL;
            }
            else if (IoTHubClient_Auth_Get_Credential_Type(transport_data->authorization_module) == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY &&
                ((device->deviceKey == NULL) || (strcmp(IoTHubClient_Auth_Get_DeviceKey(transport_data->authorization_module), device->deviceKey) != 0)))
            {
                LogError("IoTHubTransport_MQTT_Common_Register: deviceKey does not match.");
                result = NULL;
            }
            else
            {
                if (transport_data->isRegistered == true)
                {
                    LogError("Transport already has device registered by id: [%s]", device->deviceId);
                    result = NULL;
                }
                else
                {
                    transport_data->isRegistered = true;
                    result = (TRANSPORT_LL_HANDLE)handle;
                }
            }
        }
    }

    return result;
}